

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__create_png_image
              (stbi__png *a,stbi_uc *image_data,stbi__uint32 image_data_len,int out_n,int depth,
              int color,int interlaced)

{
  uint x_00;
  uint y_00;
  uint uVar1;
  int iVar2;
  stbi_uc *__ptr;
  int out_x;
  int out_y;
  stbi__uint32 img_len;
  int y;
  int x;
  int j;
  int i;
  int yspc [7];
  int xspc [7];
  int yorig [7];
  int xorig [7];
  int p;
  stbi_uc *final;
  int color_local;
  int depth_local;
  int out_n_local;
  stbi__uint32 image_data_len_local;
  stbi_uc *image_data_local;
  stbi__png *a_local;
  
  if (interlaced == 0) {
    a_local._4_4_ =
         stbi__create_png_image_raw
                   (a,image_data,image_data_len,out_n,a->s->img_x,a->s->img_y,depth,color);
  }
  else {
    __ptr = (stbi_uc *)stbi__malloc((ulong)(a->s->img_x * a->s->img_y * out_n));
    depth_local = image_data_len;
    _out_n_local = image_data;
    for (xorig[5] = 0; xorig[5] < 7; xorig[5] = xorig[5] + 1) {
      stack0xffffffffffffffa8 = 0x400000000;
      stack0xffffffffffffff88 = 0;
      yorig[0] = 4;
      yorig[1] = 0;
      yorig[2] = 2;
      yorig[3] = 0;
      yorig[4] = 1;
      stack0xffffffffffffff68 = 0x800000008;
      xspc[0] = 4;
      xspc[1] = 4;
      xspc[2] = 2;
      xspc[3] = 2;
      xspc[4] = 1;
      _j = 0x800000008;
      yspc[0] = 8;
      yspc[1] = 4;
      yspc[2] = 4;
      yspc[3] = 2;
      yspc[4] = 2;
      x_00 = (((a->s->img_x - yorig[(long)xorig[5] + 6]) + yspc[(long)xorig[5] + 6]) - 1) /
             (uint)yspc[(long)xorig[5] + 6];
      y_00 = (((a->s->img_y - xspc[(long)xorig[5] + 6]) + (&j)[xorig[5]]) - 1) /
             (uint)(&j)[xorig[5]];
      if ((x_00 != 0) && (y_00 != 0)) {
        uVar1 = (((int)(a->s->img_n * x_00 * depth + 7) >> 3) + 1) * y_00;
        iVar2 = stbi__create_png_image_raw(a,_out_n_local,depth_local,out_n,x_00,y_00,depth,color);
        if (iVar2 == 0) {
          free(__ptr);
          return 0;
        }
        for (y = 0; y < (int)y_00; y = y + 1) {
          for (x = 0; x < (int)x_00; x = x + 1) {
            memcpy(__ptr + (long)((x * yspc[(long)xorig[5] + 6] + yorig[(long)xorig[5] + 6]) * out_n
                                 ) + (ulong)((y * (&j)[xorig[5]] + xspc[(long)xorig[5] + 6]) *
                                             a->s->img_x * out_n),
                   a->out + (int)((y * x_00 + x) * out_n),(long)out_n);
          }
        }
        free(a->out);
        _out_n_local = _out_n_local + uVar1;
        depth_local = depth_local - uVar1;
      }
    }
    a->out = __ptr;
    a_local._4_4_ = 1;
  }
  return a_local._4_4_;
}

Assistant:

static int stbi__create_png_image(stbi__png *a, stbi_uc *image_data, stbi__uint32 image_data_len, int out_n, int depth, int color, int interlaced)
{
   stbi_uc *final;
   int p;
   if (!interlaced)
      return stbi__create_png_image_raw(a, image_data, image_data_len, out_n, a->s->img_x, a->s->img_y, depth, color);

   // de-interlacing
   final = (stbi_uc *) stbi__malloc(a->s->img_x * a->s->img_y * out_n);
   for (p=0; p < 7; ++p) {
      int xorig[] = { 0,4,0,2,0,1,0 };
      int yorig[] = { 0,0,4,0,2,0,1 };
      int xspc[]  = { 8,8,4,4,2,2,1 };
      int yspc[]  = { 8,8,8,4,4,2,2 };
      int i,j,x,y;
      // pass1_x[4] = 0, pass1_x[5] = 1, pass1_x[12] = 1
      x = (a->s->img_x - xorig[p] + xspc[p]-1) / xspc[p];
      y = (a->s->img_y - yorig[p] + yspc[p]-1) / yspc[p];
      if (x && y) {
         stbi__uint32 img_len = ((((a->s->img_n * x * depth) + 7) >> 3) + 1) * y;
         if (!stbi__create_png_image_raw(a, image_data, image_data_len, out_n, x, y, depth, color)) {
            STBI_FREE(final);
            return 0;
         }
         for (j=0; j < y; ++j) {
            for (i=0; i < x; ++i) {
               int out_y = j*yspc[p]+yorig[p];
               int out_x = i*xspc[p]+xorig[p];
               memcpy(final + out_y*a->s->img_x*out_n + out_x*out_n,
                      a->out + (j*x+i)*out_n, out_n);
            }
         }
         STBI_FREE(a->out);
         image_data += img_len;
         image_data_len -= img_len;
      }
   }
   a->out = final;

   return 1;
}